

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O3

bool __thiscall ZAP::Archive::parseHeader(Archive *this)

{
  std::istream::seekg(this->stream,0,0);
  std::istream::read((char *)this->stream,(long)&this->header);
  std::istream::read((char *)this->stream,(long)&(this->header).version);
  std::istream::read((char *)this->stream,(long)&(this->header).compression);
  return (this->header).version == '\0' && (this->header).magic == 0x415a;
}

Assistant:

bool Archive::parseHeader()
	{
		// We assume that stream is open
		stream->seekg(MAGIC_POS);
		readField(stream, &header.magic);
		readField(stream, &header.version);
		readField(stream, &header.compression);

		if (header.magic != MAGIC_CHARS)
			return false;
		if (header.version < static_cast<std::uint8_t>(Version::MIN) || header.version > static_cast<std::uint8_t>(Version::MAX))
			return false;

		return true;
	}